

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

Txid * __thiscall
cfd::core::AbstractTransaction::GetTxid(Txid *__return_storage_ptr__,AbstractTransaction *this)

{
  ByteData256 bytedata;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  GetHash((ByteData256 *)&_Stack_28,this);
  Txid::Txid(__return_storage_ptr__,(ByteData256 *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

Txid AbstractTransaction::GetTxid() const {
  ByteData256 bytedata = GetHash();
  return Txid(bytedata);
}